

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# projectile.cpp
# Opt level: O1

void __thiscall CProjectile::Tick(CProjectile *this)

{
  int iVar1;
  uint uVar2;
  CGameWorld *pCVar3;
  IServer *pIVar4;
  vec2 Force;
  vec2 vVar5;
  bool bVar6;
  int iVar7;
  CCharacter *pCVar8;
  long in_FS_OFFSET;
  float fVar9;
  vec2 CurPos;
  vec2 local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar3 = (this->super_CEntity).m_pGameWorld;
  pIVar4 = pCVar3->m_pServer;
  iVar1 = pIVar4->m_CurrentGameTick;
  uVar2 = this->m_StartTick;
  fVar9 = (float)pIVar4->m_TickSpeed;
  vVar5 = GetPos(this,(float)(int)(~uVar2 + iVar1) / fVar9);
  local_30 = GetPos(this,(float)(int)(iVar1 - uVar2) / fVar9);
  iVar7 = CCollision::IntersectLine
                    (&pCVar3->m_pGameServer->m_Collision,vVar5,local_30,&local_30,(vec2 *)0x0);
  pCVar8 = CGameContext::GetPlayerChar
                     (((this->super_CEntity).m_pGameWorld)->m_pGameServer,this->m_Owner);
  pCVar8 = CGameWorld::IntersectCharacter
                     ((this->super_CEntity).m_pGameWorld,vVar5,local_30,6.0,&local_30,
                      &pCVar8->super_CEntity);
  iVar1 = this->m_LifeSpan;
  this->m_LifeSpan = iVar1 + -1;
  if (0 < iVar1 && (iVar7 == 0 && pCVar8 == (CCharacter *)0x0)) {
    bVar6 = CEntity::GameLayerClipped(&this->super_CEntity,local_30);
    if (!bVar6) goto LAB_00119905;
  }
  if ((-1 < this->m_LifeSpan) || (this->m_Weapon == 3)) {
    CGameContext::CreateSound
              (((this->super_CEntity).m_pGameWorld)->m_pGameServer,local_30,this->m_SoundImpact,-1);
  }
  if (this->m_Explosive == true) {
    CGameContext::CreateExplosion
              (((this->super_CEntity).m_pGameWorld)->m_pGameServer,local_30,this->m_Owner,
               this->m_Weapon,this->m_Damage);
  }
  else if (pCVar8 != (CCharacter *)0x0) {
    fVar9 = 0.001;
    if (0.001 <= this->m_Force) {
      fVar9 = this->m_Force;
    }
    vVar5 = this->m_Direction;
    Force.field_1.y = fVar9 * vVar5.field_1.y;
    Force.field_0.x = fVar9 * vVar5.field_0.x;
    CCharacter::TakeDamage
              (pCVar8,Force,(vec2)((ulong)vVar5 ^ 0x8000000080000000),this->m_Damage,this->m_Owner,
               this->m_Weapon);
  }
  CGameWorld::DestroyEntity((this->super_CEntity).m_pGameWorld,&this->super_CEntity);
LAB_00119905:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CProjectile::Tick()
{
	float Pt = (Server()->Tick()-m_StartTick-1)/(float)Server()->TickSpeed();
	float Ct = (Server()->Tick()-m_StartTick)/(float)Server()->TickSpeed();
	vec2 PrevPos = GetPos(Pt);
	vec2 CurPos = GetPos(Ct);
	int Collide = GameServer()->Collision()->IntersectLine(PrevPos, CurPos, &CurPos, 0);
	CCharacter *OwnerChar = GameServer()->GetPlayerChar(m_Owner);
	CCharacter *TargetChr = GameWorld()->IntersectCharacter(PrevPos, CurPos, 6.0f, CurPos, OwnerChar);

	m_LifeSpan--;

	if(TargetChr || Collide || m_LifeSpan < 0 || GameLayerClipped(CurPos))
	{
		if(m_LifeSpan >= 0 || m_Weapon == WEAPON_GRENADE)
			GameServer()->CreateSound(CurPos, m_SoundImpact);

		if(m_Explosive)
			GameServer()->CreateExplosion(CurPos, m_Owner, m_Weapon, m_Damage);

		else if(TargetChr)
			TargetChr->TakeDamage(m_Direction * maximum(0.001f, m_Force), m_Direction*-1, m_Damage, m_Owner, m_Weapon);

		GameWorld()->DestroyEntity(this);
	}
}